

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QWizardDefaultProperty>::relocate
          (QArrayDataPointer<QWizardDefaultProperty> *this,qsizetype offset,
          QWizardDefaultProperty **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QWizardDefaultProperty> *in_RDI;
  QWizardDefaultProperty **unaff_retaddr;
  QWizardDefaultProperty *res;
  QWizardDefaultProperty *first;
  QArrayDataPointer<QWizardDefaultProperty> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QWizardDefaultProperty,long_long>
            (first,(longlong)in_RDI,(QWizardDefaultProperty *)0x7c5e14);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QWizardDefaultProperty>,QWizardDefaultProperty_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x48 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }